

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O2

string * __thiscall
cfd::js::api::json::
ExecuteJsonApi<cfd::js::api::json::CalculateEcSignatureRequest,cfd::js::api::json::SignatureDataResponse,cfd::js::api::CalculateEcSignatureRequestStruct,cfd::js::api::SignatureDataResponseStruct>
          (string *__return_storage_ptr__,json *this,string *request_message,
          function<cfd::js::api::SignatureDataResponseStruct_(const_cfd::js::api::CalculateEcSignatureRequestStruct_&)>
          *call_function)

{
  string local_380;
  CalculateEcSignatureRequestStruct request;
  SignatureDataResponse res;
  SignatureDataResponseStruct response;
  CalculateEcSignatureRequest req;
  
  CalculateEcSignatureRequest::CalculateEcSignatureRequest(&req);
  core::JsonClassBase<cfd::js::api::json::CalculateEcSignatureRequest>::Deserialize
            (&req.super_JsonClassBase<cfd::js::api::json::CalculateEcSignatureRequest>,
             (string *)this);
  CalculateEcSignatureRequest::ConvertToStruct(&request,&req);
  std::
  function<cfd::js::api::SignatureDataResponseStruct_(const_cfd::js::api::CalculateEcSignatureRequestStruct_&)>
  ::operator()(&response,
               (function<cfd::js::api::SignatureDataResponseStruct_(const_cfd::js::api::CalculateEcSignatureRequestStruct_&)>
                *)request_message,&request);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (response.error.code == 0) {
    SignatureDataResponse::SignatureDataResponse(&res);
    SignatureDataResponse::ConvertFromStruct(&res,&response);
    core::JsonClassBase<cfd::js::api::json::SignatureDataResponse>::Serialize_abi_cxx11_
              (&local_380,&res.super_JsonClassBase<cfd::js::api::json::SignatureDataResponse>);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_380);
    std::__cxx11::string::~string((string *)&local_380);
    SignatureDataResponse::~SignatureDataResponse(&res);
  }
  else {
    ErrorResponse::ConvertFromStruct((ErrorResponse *)&res,&response.error);
    core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_
              (&local_380,(JsonClassBase<cfd::js::api::json::ErrorResponseBase> *)&res);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_380);
    std::__cxx11::string::~string((string *)&local_380);
    ErrorResponseBase::~ErrorResponseBase((ErrorResponseBase *)&res);
  }
  SignatureDataResponseStruct::~SignatureDataResponseStruct(&response);
  CalculateEcSignatureRequestStruct::~CalculateEcSignatureRequestStruct(&request);
  CalculateEcSignatureRequest::~CalculateEcSignatureRequest(&req);
  return __return_storage_ptr__;
}

Assistant:

std::string ExecuteJsonApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        call_function) {
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response = call_function(request);
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}